

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dagify.cpp
# Opt level: O0

void __thiscall
handlegraph::algorithms::SubHandleGraph::add_handle(SubHandleGraph *this,handle_t *handle)

{
  longlong *plVar1;
  undefined8 in_RSI;
  long in_RDI;
  nid_t node_id;
  value_type *in_stack_ffffffffffffffd8;
  undefined1 in_stack_ffffffffffffffe0;
  undefined7 in_stack_ffffffffffffffe1;
  longlong local_18 [3];
  
  local_18[0] = (**(code **)(**(long **)(in_RDI + 8) + 0x20))(*(long **)(in_RDI + 8),in_RSI);
  plVar1 = std::min<long_long>(local_18,(longlong *)(in_RDI + 0x48));
  *(longlong *)(in_RDI + 0x48) = *plVar1;
  plVar1 = std::max<long_long>(local_18,(longlong *)(in_RDI + 0x50));
  *(longlong *)(in_RDI + 0x50) = *plVar1;
  std::
  unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
  ::insert((unordered_set<long_long,_std::hash<long_long>,_std::equal_to<long_long>,_std::allocator<long_long>_>
            *)CONCAT71(in_stack_ffffffffffffffe1,in_stack_ffffffffffffffe0),
           in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void SubHandleGraph::add_handle(const handle_t& handle) {
    
    nid_t node_id = super->get_id(handle);
    
    min_id = min(node_id, min_id);
    max_id = max(node_id, max_id);
    
    contents.insert(node_id);
}